

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O3

bool __thiscall
CPubKey::Derive(CPubKey *this,CPubKey *pubkeyChild,ChainCode *ccChild,uint nChild,ChainCode *cc)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_t inputlen;
  long in_FS_OFFSET;
  size_t publen;
  uchar pub [33];
  secp256k1_pubkey pubkey;
  uchar out [64];
  size_t local_e0;
  uchar local_d8 [48];
  secp256k1_pubkey local_a8;
  uchar local_68 [32];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->vch[0];
  if ((bVar1 & 0xfe) != 2) {
    if ((7 < bVar1) || ((0xd0U >> (bVar1 & 0x1f) & 1) == 0)) {
      __assert_fail("IsValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/pubkey.cpp"
                    ,0x14d,
                    "bool CPubKey::Derive(CPubKey &, ChainCode &, unsigned int, const ChainCode &) const"
                   );
    }
    if (-1 < (int)nChild) {
      __assert_fail("size() == COMPRESSED_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/pubkey.cpp"
                    ,0x14f,
                    "bool CPubKey::Derive(CPubKey &, ChainCode &, unsigned int, const ChainCode &) const"
                   );
    }
LAB_00825e5b:
    __assert_fail("(nChild >> 31) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/pubkey.cpp"
                  ,0x14e,
                  "bool CPubKey::Derive(CPubKey &, ChainCode &, unsigned int, const ChainCode &) const"
                 );
  }
  if ((int)nChild < 0) goto LAB_00825e5b;
  BIP32Hash(cc,nChild,bVar1,this->vch + 1,local_68);
  *(undefined8 *)((ccChild->super_base_blob<256U>).m_data._M_elems + 0x10) = local_38;
  *(undefined8 *)((ccChild->super_base_blob<256U>).m_data._M_elems + 0x18) = uStack_30;
  *(undefined8 *)(ccChild->super_base_blob<256U>).m_data._M_elems = local_48;
  *(undefined8 *)((ccChild->super_base_blob<256U>).m_data._M_elems + 8) = uStack_40;
  inputlen = 0x21;
  if ((this->vch[0] & 0xfe) != 2) {
    bVar1 = this->vch[0] - 4;
    if (bVar1 < 4) {
      inputlen = *(size_t *)(&DAT_00e3c9f0 + (ulong)bVar1 * 8);
    }
    else {
      inputlen = 0;
    }
  }
  iVar3 = secp256k1_ec_pubkey_parse(secp256k1_context_static,&local_a8,this->vch,inputlen);
  if (iVar3 != 0) {
    iVar3 = secp256k1_ec_pubkey_tweak_add(secp256k1_context_static,&local_a8,local_68);
    if (iVar3 != 0) {
      local_e0 = 0x21;
      secp256k1_ec_pubkey_serialize(secp256k1_context_static,local_d8,&local_e0,&local_a8,0x102);
      Set<unsigned_char*>(pubkeyChild,local_d8,local_d8 + local_e0);
      bVar2 = true;
      goto LAB_00825e07;
    }
  }
  bVar2 = false;
LAB_00825e07:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CPubKey::Derive(CPubKey& pubkeyChild, ChainCode &ccChild, unsigned int nChild, const ChainCode& cc) const {
    assert(IsValid());
    assert((nChild >> 31) == 0);
    assert(size() == COMPRESSED_SIZE);
    unsigned char out[64];
    BIP32Hash(cc, nChild, *begin(), begin()+1, out);
    memcpy(ccChild.begin(), out+32, 32);
    secp256k1_pubkey pubkey;
    if (!secp256k1_ec_pubkey_parse(secp256k1_context_static, &pubkey, vch, size())) {
        return false;
    }
    if (!secp256k1_ec_pubkey_tweak_add(secp256k1_context_static, &pubkey, out)) {
        return false;
    }
    unsigned char pub[COMPRESSED_SIZE];
    size_t publen = COMPRESSED_SIZE;
    secp256k1_ec_pubkey_serialize(secp256k1_context_static, pub, &publen, &pubkey, SECP256K1_EC_COMPRESSED);
    pubkeyChild.Set(pub, pub + publen);
    return true;
}